

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O0

void __thiscall KDReports::ReportBuilder::addVariable(ReportBuilder *this,VariableType variable)

{
  MoveMode pos;
  QTextCursor *pQVar1;
  QTextDocument *pQVar2;
  qsizetype qVar3;
  QTextCharFormat local_c8 [16];
  QTextCursor local_b8 [8];
  QTextCursor docCursor;
  QTextCharFormat origCharFormat;
  undefined1 local_a0 [8];
  TextElement element;
  QArrayDataPointer<char16_t> local_70;
  undefined1 local_58 [8];
  QString value;
  int charPosition;
  QTextCursor *cursor;
  VariableType variable_local;
  ReportBuilder *this_local;
  char16_t *str;
  
  pQVar1 = ReportBuilder::cursor(this);
  value.d.size._4_4_ = QTextCursor::position();
  if (variable == PageCount) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_70,(Data *)0x0,L"UNKNOWN YET",0xb);
    QString::QString((QString *)local_58,&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  else {
    variableValue((QString *)local_58,0,this->m_report,variable);
  }
  TextElement::TextElement((TextElement *)local_a0,(QString *)local_58);
  QTextCursor::charFormat();
  pQVar2 = currentDocument(this);
  QTextCursor::QTextCursor(local_b8,pQVar2);
  QTextCursor::setPosition((int)local_b8,value.d.size._4_4_);
  QTextCursor::charFormat();
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QTextCharFormat::~QTextCharFormat(local_c8);
  QTextCursor::beginEditBlock();
  TextElement::build((TextElement *)local_a0,this);
  QTextCursor::endEditBlock();
  pQVar2 = currentDocument(this);
  pos = value.d.size._4_4_;
  qVar3 = QString::length((QString *)local_58);
  setVariableMarker(pQVar2,pos,variable,(int)qVar3);
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QTextCursor::~QTextCursor(local_b8);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)&docCursor);
  TextElement::~TextElement((TextElement *)local_a0);
  QString::~QString((QString *)local_58);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVariable(KDReports::VariableType variable)
{
    QTextCursor &cursor = this->cursor();
    const int charPosition = cursor.position();
    // Don't ask for the value of PageCount yet -- it would create a documentlayout
    // which would make any later insertion into the textdocument much, much slower.
    const QString value = variable == KDReports::PageCount ? QStringLiteral("UNKNOWN YET") : variableValue(0 /*pageNumber*/, m_report, variable);
    KDReports::TextElement element(value);

    const QTextCharFormat origCharFormat = cursor.charFormat();

    // Keep the current font (KDRE-91).
    QTextCursor docCursor(&currentDocument());
    docCursor.setPosition(charPosition);
    cursor.setCharFormat(docCursor.charFormat());

    cursor.beginEditBlock();
    element.build(*this);
    cursor.endEditBlock();

    setVariableMarker(currentDocument(), charPosition, variable, value.length());

    cursor.setCharFormat(origCharFormat); // restore the orig format
}